

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_data.c
# Opt level: O3

LY_ERR lyd_print_(ly_out *out,lyd_node *root,LYD_FORMAT format,uint32_t options)

{
  LY_ERR LVar1;
  lys_module *plVar2;
  ly_ctx *ctx;
  
  switch(format) {
  case LYD_UNKNOWN:
    if (root == (lyd_node *)0x0) {
      ctx = (ly_ctx *)0x0;
    }
    else {
      if (root->schema == (lysc_node *)0x0) {
        plVar2 = (lys_module *)&root[2].schema;
      }
      else {
        plVar2 = root->schema->module;
      }
      ctx = plVar2->ctx;
    }
    LVar1 = LY_EINT;
    ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_data.c",
           0x2a);
    break;
  case LYD_XML:
    LVar1 = xml_print_data(out,root,options);
    return LVar1;
  case LYD_JSON:
    LVar1 = json_print_data(out,root,options);
    return LVar1;
  case LYD_LYB:
    LVar1 = lyb_print_data(out,root,options);
    return LVar1;
  default:
    LVar1 = LY_SUCCESS;
  }
  return LVar1;
}

Assistant:

static LY_ERR
lyd_print_(struct ly_out *out, const struct lyd_node *root, LYD_FORMAT format, uint32_t options)
{
    LY_ERR ret = LY_SUCCESS;

    switch (format) {
    case LYD_XML:
        ret = xml_print_data(out, root, options);
        break;
    case LYD_JSON:
        ret = json_print_data(out, root, options);
        break;
    case LYD_LYB:
        ret = lyb_print_data(out, root, options);
        break;
    case LYD_UNKNOWN:
        LOGINT(root ? LYD_CTX(root) : NULL);
        ret = LY_EINT;
        break;
    }

    return ret;
}